

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall
Connection::Connection(Connection *this,string *name_from,string *name_to,string *label)

{
  bool bVar1;
  reference pcVar2;
  char local_71;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  char c_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  string *__range1_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *label_local;
  string *name_to_local;
  string *name_from_local;
  Connection *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name_from);
  std::__cxx11::string::string((string *)&this->name_to,(string *)name_to);
  std::__cxx11::string::string((string *)&this->label,(string *)label);
  std::__cxx11::string::operator=((string *)this,"");
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_50._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    __range1_1._7_1_ = *pcVar2;
    if (__range1_1._7_1_ == '#') {
      __range1_1._7_1_ = '_';
    }
    std::__cxx11::string::operator+=((string *)this,__range1_1._7_1_);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator=((string *)&this->name_to,"");
  __end1_1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_70._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff90);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_1);
    local_71 = *pcVar2;
    if (local_71 == '#') {
      local_71 = '_';
    }
    std::__cxx11::string::operator+=((string *)&this->name_to,local_71);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

Connection::Connection(const string &name_from, const string &name_to, const string &label) : name_from(name_from),
                                                                                              name_to(name_to),
                                                                                              label(label) {
    this->name_from = "";
    for (char c: name_from) {
        if (c == '#')
            c = '_';
        this->name_from += c;
    }

    this->name_to = "";
    for (char c: name_to) {
        if (c == '#')
            c = '_';
        this->name_to += c;
    }
}